

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O3

void skiwi::compile_member_cmp_equal(asmcode *code,compiler_options *param_2)

{
  operation local_40;
  operand local_3c [3];
  
  local_40 = LABEL;
  assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[27]>
            (code,&local_40,(char (*) [27])"L_compile_member_cmp_equal");
  local_40 = PUSH;
  local_3c[0] = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,local_3c);
  local_40 = PUSH;
  local_3c[0] = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,local_3c);
  local_40 = PUSH;
  local_3c[0] = RAX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,local_3c);
  local_40 = MOV;
  local_3c[0] = R11;
  local_3c[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_40,local_3c,local_3c + 1);
  local_40 = MOV;
  local_3c[0] = R15;
  local_3c[1] = 0x42;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,char_const(&)[20]>
            (code,&local_40,local_3c,local_3c + 1,(char (*) [20])"L_recursively_equal");
  local_40 = CALL;
  local_3c[0] = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,local_3c);
  local_40 = MOV;
  local_3c[0] = R11;
  local_3c[1] = 0x39;
  local_3c[2] = 0xf;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_40,local_3c,local_3c + 1,(int *)(local_3c + 2));
  local_40 = CMP;
  local_3c[0] = RAX;
  local_3c[1] = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_40,local_3c,local_3c + 1);
  local_40 = POP;
  local_3c[0] = RAX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,local_3c);
  local_40 = POP;
  local_3c[0] = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,local_3c);
  local_40 = POP;
  local_3c[0] = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_40,local_3c);
  local_40 = RET;
  assembler::asmcode::add<assembler::asmcode::operation>(code,&local_40);
  return;
}

Assistant:

void compile_member_cmp_equal(asmcode& code, const compiler_options&)
  {
  // this method gets its arguments in rax and r15, and sets the Z flag
  code.add(asmcode::LABEL, "L_compile_member_cmp_equal");
  code.add(asmcode::PUSH, asmcode::R11);
  code.add(asmcode::PUSH, asmcode::R15);
  code.add(asmcode::PUSH, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::R15);
  code.add(asmcode::MOV, asmcode::R15, asmcode::LABELADDRESS, "L_recursively_equal");
  code.add(asmcode::CALL, asmcode::R15);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, bool_t);
  code.add(asmcode::CMP, asmcode::RAX, asmcode::R11);
  code.add(asmcode::POP, asmcode::RAX);
  code.add(asmcode::POP, asmcode::R15);
  code.add(asmcode::POP, asmcode::R11);
  code.add(asmcode::RET);
  }